

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileHelper.h
# Opt level: O2

void __thiscall Assimp::XFile::Node::~Node(Node *this)

{
  pointer ppNVar1;
  Node *this_00;
  pointer ppMVar2;
  Mesh *this_01;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppNVar1 = (this->mChildren).
              super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mChildren).
                      super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <=
        (ulong)uVar3) break;
    this_00 = ppNVar1[uVar3];
    if (this_00 != (Node *)0x0) {
      ~Node(this_00);
    }
    operator_delete(this_00,0x98);
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    ppMVar2 = (this->mMeshes).
              super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mMeshes).
                      super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3) <=
        (ulong)uVar3) break;
    this_01 = ppMVar2[uVar3];
    if (this_01 != (Mesh *)0x0) {
      XFile::Mesh::~Mesh(this_01);
    }
    operator_delete(this_01,600);
    uVar3 = uVar3 + 1;
  }
  std::_Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::~_Vector_base
            (&(this->mMeshes).
              super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>);
  std::_Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::~_Vector_base
            (&(this->mChildren).
              super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Node() {
        for (unsigned int a = 0; a < mChildren.size(); ++a ) {
            delete mChildren[a];
        }
        for (unsigned int a = 0; a < mMeshes.size(); ++a) {
            delete mMeshes[a];
        }
    }